

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O1

void __thiscall
booster::aio::event_loop_impl::post(event_loop_impl *this,event_handler *h,error_code *e)

{
  lock_guard l;
  unique_lock<std::recursive_mutex> local_58;
  completion_handler local_48;
  
  local_58._M_device = &this->data_mutex_;
  local_58._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_58);
  local_58._M_owns = true;
  local_48.h.p_ = &((h->call_ptr).p_)->super_refcounted;
  if (local_48.h.p_ != (refcounted *)0x0) {
    atomic_counter::inc(&(local_48.h.p_)->refs_);
  }
  local_48.e._M_value = e->_M_value;
  local_48.e._4_4_ = *(undefined4 *)&e->field_0x4;
  local_48.e._M_cat = e->_M_cat;
  local_48.n = 0;
  local_48.type = completion_handler::op_event_handler;
  std::
  deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
  ::emplace_back<booster::aio::event_loop_impl::completion_handler>
            (&this->dispatch_queue_,&local_48);
  intrusive_ptr<booster::refcounted>::~intrusive_ptr(&local_48.h);
  if (this->polling_ == true) {
    impl::select_interrupter::notify(&this->interrupter_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
  return;
}

Assistant:

void post(event_handler const &h,booster::system::error_code const &e)
	{
		lock_guard l(data_mutex_);
		dispatch_queue_.push_back(completion_handler(h,e));
		if(polling_)
			wake();
	}